

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_relative_branch(m68k_info *info,int opcode,int size,int displacement)

{
  cs_m68k *pcVar1;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  m68k_info *in_RDI;
  cs_m68k *ext;
  cs_m68k_op *op;
  undefined8 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  
  pcVar1 = build_init_op((m68k_info *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe8,
                         (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  pcVar1->operands[0].type = M68K_OP_BR_DISP;
  pcVar1->operands[0].address_mode = M68K_AM_BRANCH_DISPLACEMENT;
  pcVar1->operands[0].br_disp.disp = in_ECX;
  pcVar1->operands[0].br_disp.disp_size = (uint8_t)in_EDX;
  set_insn_group(in_RDI,M68K_GRP_JUMP);
  set_insn_group(in_RDI,M68K_GRP_BRANCH_RELATIVE);
  return;
}

Assistant:

static void build_relative_branch(m68k_info *info, int opcode, int size, int displacement)
{
	cs_m68k_op* op;
	cs_m68k* ext = build_init_op(info, opcode, 1, size);

	op = &ext->operands[0];

	op->type = M68K_OP_BR_DISP;
	op->address_mode = M68K_AM_BRANCH_DISPLACEMENT;
	op->br_disp.disp = displacement;
	op->br_disp.disp_size = size;

	set_insn_group(info, M68K_GRP_JUMP);
	set_insn_group(info, M68K_GRP_BRANCH_RELATIVE);
}